

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<Header>::relocate(QArrayDataPointer<Header> *this,qsizetype offset,Header **data)

{
  bool bVar1;
  long n;
  Header *in_RDX;
  long in_RSI;
  Header *in_RDI;
  Header **unaff_retaddr;
  Header *res;
  Header *c;
  
  n = *(long *)((long)&(in_RDI->name).data.
                       super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
                       super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                       super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                       super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                       super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray> + 8) +
      in_RSI * 0x38;
  c = in_RDI;
  QtPrivate::q_relocate_overlap_n<Header,long_long>(in_RDX,n,in_RDI);
  if ((in_RDX != (Header *)0x0) &&
     (bVar1 = QtPrivate::q_points_into_range<QArrayDataPointer<Header>,Header_const*>
                        (unaff_retaddr,(QArrayDataPointer<Header> *)c), bVar1)) {
    *(long *)&(in_RDX->name).data.super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
              super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
              super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
              super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
              super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray> =
         in_RSI * 0x38 +
         *(long *)&(in_RDX->name).data.
                   super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
                   super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                   super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                   super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                   super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>;
  }
  *(long *)((long)&(in_RDI->name).data.
                   super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
                   super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                   super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                   super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                   super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray> + 8) = n;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }